

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::SimpleDateFormat::matchDayPeriodStrings
          (SimpleDateFormat *this,UnicodeString *text,int32_t start,UnicodeString *data,
          int32_t dataCount,int32_t *dayPeriod)

{
  int32_t iVar1;
  ulong uVar2;
  int32_t iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = 0;
  uVar5 = (ulong)(uint)dataCount;
  if (dataCount < 1) {
    uVar5 = uVar2;
  }
  uVar4 = 0xffffffffffffffff;
  iVar3 = 0;
  for (; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = matchStringWithOptionalDot(text,start,data);
    if (iVar3 < iVar1) {
      uVar4 = uVar2;
      iVar3 = iVar1;
    }
    uVar4 = uVar4 & 0xffffffff;
    data = data + 1;
  }
  if ((int)uVar4 < 0) {
    iVar3 = -start;
  }
  else {
    *dayPeriod = (int)uVar4;
    iVar3 = iVar3 + start;
  }
  return iVar3;
}

Assistant:

int32_t SimpleDateFormat::matchDayPeriodStrings(const UnicodeString& text, int32_t start,
                              const UnicodeString* data, int32_t dataCount,
                              int32_t &dayPeriod) const
{

    int32_t bestMatchLength = 0, bestMatch = -1;

    for (int32_t i = 0; i < dataCount; ++i) {
        int32_t matchLength = 0;
        if ((matchLength = matchStringWithOptionalDot(text, start, data[i])) > bestMatchLength) {
            bestMatchLength = matchLength;
            bestMatch = i;
        }
    }

    if (bestMatch >= 0) {
        dayPeriod = bestMatch;
        return start + bestMatchLength;
    }

    return -start;
}